

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkMemAbstractTest(Wlc_Ntk_t *p)

{
  Vec_Wec_t *p_00;
  Vec_Int_t *vNodeFrames_00;
  Wlc_Ntk_t *pWVar1;
  Wlc_Ntk_t *pNewFull;
  Vec_Int_t *vNodeFrames;
  Vec_Wec_t *vRefines;
  Vec_Int_t *vMemFanins;
  Vec_Int_t *vMemObjs;
  Vec_Int_t *vRefine;
  int nDcBits;
  int iFirstMemCi;
  int iFirstCi;
  int iFirstMemPi;
  Wlc_Ntk_t *p_local;
  
  _iFirstCi = p;
  vMemFanins = Wlc_NtkCollectMemory(p,0);
  vRefines = (Vec_Wec_t *)Wlc_NtkCollectMemFanins(_iFirstCi,vMemFanins);
  p_00 = Vec_WecAlloc(100);
  vNodeFrames_00 = Vec_IntAlloc(100);
  vMemObjs = Vec_WecPushLevel(p_00);
  Vec_IntPush(vMemObjs,0x5800);
  Vec_IntPush(vMemObjs,0x5000);
  Vec_IntPush(vMemObjs,0x4000);
  Vec_IntPush(vMemObjs,0x4800);
  Wlc_NtkAbsAddToNodeFrames(vNodeFrames_00,vMemObjs);
  pWVar1 = Wlc_NtkAbstractMemory
                     (_iFirstCi,vMemFanins,(Vec_Int_t *)0x0,&iFirstMemCi,&nDcBits,
                      (int *)((long)&vRefine + 4),p_00,vNodeFrames_00);
  Vec_WecFree(p_00);
  Vec_IntFree(vNodeFrames_00);
  vRefine._0_4_ = Wlc_CountDcs(pWVar1->pInits);
  printf("iFirstMemPi = %d  iFirstCi = %d  iFirstMemCi = %d  nDcBits = %d\n",
         (ulong)(uint)iFirstMemCi,(ulong)(uint)nDcBits,(ulong)vRefine._4_4_,(ulong)(uint)vRefine);
  Vec_IntFreeP(&vMemFanins);
  Vec_IntFreeP((Vec_Int_t **)&vRefines);
  return pWVar1;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkMemAbstractTest( Wlc_Ntk_t * p )
{
    int iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits;
    Vec_Int_t * vRefine;
    Vec_Int_t * vMemObjs    = Wlc_NtkCollectMemory( p, 0 );
    Vec_Int_t * vMemFanins  = Wlc_NtkCollectMemFanins( p, vMemObjs );

    Vec_Wec_t * vRefines    = Vec_WecAlloc( 100 );
    Vec_Int_t * vNodeFrames = Vec_IntAlloc( 100 );
    Wlc_Ntk_t * pNewFull;

    vRefine     = Vec_WecPushLevel(vRefines);
    Vec_IntPush( vRefine,  (11 << 11) | 0 );
    Vec_IntPush( vRefine,  (10 << 11) | 0 );
    Vec_IntPush( vRefine,  ( 8 << 11) | 0 );
    Vec_IntPush( vRefine,  ( 9 << 11) | 0 );
    Wlc_NtkAbsAddToNodeFrames( vNodeFrames, vRefine );

//    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, vMemFanins, &iFirstMemPi, &iFirstCi, &iFirstMemCi, NULL, NULL );
    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, NULL, &iFirstMemPi, &iFirstCi, &iFirstMemCi, vRefines, vNodeFrames );

    Vec_WecFree( vRefines );
    Vec_IntFree( vNodeFrames );

    nDcBits     = Wlc_CountDcs( pNewFull->pInits );
    printf( "iFirstMemPi = %d  iFirstCi = %d  iFirstMemCi = %d  nDcBits = %d\n", iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits );

    Vec_IntFreeP( &vMemObjs );
    Vec_IntFreeP( &vMemFanins );
    return pNewFull;
}